

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

Bool CheckMissingStyleSheets(TidyDocImpl *doc,Node *node)

{
  int iVar1;
  bool local_33;
  bool local_32;
  bool local_31;
  bool local_2f;
  bool local_2e;
  Bool local_2c;
  Node *pNStack_28;
  Bool sspresent;
  Node *content;
  AttVal *av;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  local_2c = no;
  for (pNStack_28 = node->content; local_2c == no && pNStack_28 != (Node *)0x0;
      pNStack_28 = pNStack_28->next) {
    if (((((pNStack_28 == (Node *)0x0) || (pNStack_28->tag == (Dict *)0x0)) ||
         (local_2e = true, pNStack_28->tag->id != TidyTag_LINK)) &&
        (((pNStack_28 == (Node *)0x0 || (pNStack_28->tag == (Dict *)0x0)) ||
         (local_2e = true, pNStack_28->tag->id != TidyTag_STYLE)))) &&
       (((pNStack_28 == (Node *)0x0 || (pNStack_28->tag == (Dict *)0x0)) ||
        (local_2e = true, pNStack_28->tag->id != TidyTag_FONT)))) {
      local_2f = false;
      if ((pNStack_28 != (Node *)0x0) && (local_2f = false, pNStack_28->tag != (Dict *)0x0)) {
        local_2f = pNStack_28->tag->id == TidyTag_BASEFONT;
      }
      local_2e = local_2f;
    }
    local_2c = (Bool)local_2e;
    for (content = (Node *)pNStack_28->attributes; local_2c == no && content != (Node *)0x0;
        content = content->parent) {
      if ((((((content == (Node *)0x0) || (content->prev == (Node *)0x0)) ||
            (local_31 = true, *(int *)&content->prev->parent != 0x91)) &&
           (((content == (Node *)0x0 || (content->prev == (Node *)0x0)) ||
            (local_31 = true, *(int *)&content->prev->parent != 0x95)))) &&
          (((content == (Node *)0x0 || (content->prev == (Node *)0x0)) ||
           (local_31 = true, *(int *)&content->prev->parent != 0x9f)))) &&
         (((content == (Node *)0x0 || (content->prev == (Node *)0x0)) ||
          (local_31 = true, *(int *)&content->prev->parent != 8)))) {
        local_32 = false;
        if ((content != (Node *)0x0) && (local_32 = false, content->prev != (Node *)0x0)) {
          local_32 = *(int *)&content->prev->parent == 0x4e;
        }
        local_31 = local_32;
      }
      local_2c = (Bool)local_31;
      if (((local_2c == no) && (content != (Node *)0x0)) &&
         ((content->prev != (Node *)0x0 && (*(int *)&content->prev->parent == 0x7c)))) {
        local_33 = false;
        if ((content != (Node *)0x0) && (local_33 = false, content->was != (Dict *)0x0)) {
          iVar1 = prvTidytmbstrcasecmp((ctmbstr)content->was,"stylesheet");
          local_33 = iVar1 == 0;
        }
        local_2c = (Bool)local_33;
      }
    }
    if (local_2c == no) {
      local_2c = CheckMissingStyleSheets(doc,pNStack_28);
    }
  }
  return local_2c;
}

Assistant:

static Bool CheckMissingStyleSheets( TidyDocImpl* doc, Node* node )
{
    AttVal* av;
    Node* content;
    Bool sspresent = no;

    for ( content = node->content;
          !sspresent && content != NULL;
          content = content->next )
    {
        sspresent = ( nodeIsLINK(content)  ||
                      nodeIsSTYLE(content) ||
                      nodeIsFONT(content)  ||
                      nodeIsBASEFONT(content) );

        for ( av = content->attributes;
              !sspresent && av != NULL;
              av = av->next )
        {
            sspresent = ( attrIsSTYLE(av) || attrIsTEXT(av)  ||
                          attrIsVLINK(av) || attrIsALINK(av) ||
                          attrIsLINK(av) );

            if ( !sspresent && attrIsREL(av) )
            {
                sspresent = AttrValueIs(av, "stylesheet");
            }
        }

        if ( ! sspresent )
            sspresent = CheckMissingStyleSheets( doc, content );
    }
    return sspresent;
}